

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAabbUtil2.h
# Opt level: O2

bool cbtRayAabb2(cbtVector3 *rayFrom,cbtVector3 *rayInvDirection,uint *raySign,cbtVector3 *bounds,
                cbtScalar *tmin,cbtScalar lambda_min,cbtScalar lambda_max)

{
  uint uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  undefined1 in_register_00001204 [12];
  undefined1 in_register_00001244 [12];
  
  uVar1 = *raySign;
  fVar3 = (bounds[uVar1].m_floats[0] - rayFrom->m_floats[0]) * rayInvDirection->m_floats[0];
  *tmin = fVar3;
  bVar11 = 0;
  fVar4 = rayInvDirection->m_floats[1] * (bounds[1 - raySign[1]].m_floats[1] - rayFrom->m_floats[1])
  ;
  if (fVar3 <= fVar4) {
    fVar5 = (bounds[1 - uVar1].m_floats[0] - rayFrom->m_floats[0]) * rayInvDirection->m_floats[0];
    fVar6 = (bounds[raySign[1]].m_floats[1] - rayFrom->m_floats[1]) * rayInvDirection->m_floats[1];
    if (fVar6 <= fVar5) {
      if (fVar3 < fVar6) {
        *tmin = fVar6;
        fVar3 = fVar6;
      }
      bVar11 = 0;
      fVar6 = rayInvDirection->m_floats[2] *
              (bounds[1 - raySign[2]].m_floats[2] - rayFrom->m_floats[2]);
      if (fVar3 <= fVar6) {
        auVar2 = vminss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
        fVar4 = (bounds[raySign[2]].m_floats[2] - rayFrom->m_floats[2]) *
                rayInvDirection->m_floats[2];
        if (fVar4 <= auVar2._0_4_) {
          if (fVar3 < fVar4) {
            *tmin = fVar4;
            fVar3 = fVar4;
          }
          auVar2 = vminss_avx(ZEXT416((uint)fVar6),auVar2);
          auVar10._4_12_ = in_register_00001244;
          auVar10._0_4_ = lambda_max;
          uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar3),auVar10,1);
          auVar9._4_12_ = in_register_00001204;
          auVar9._0_4_ = lambda_min;
          uVar8 = vcmpps_avx512vl(auVar9,auVar2,1);
          bVar11 = (byte)uVar7 & (byte)uVar8;
        }
      }
    }
  }
  return (bool)(bVar11 & 1);
}

Assistant:

SIMD_FORCE_INLINE bool cbtRayAabb2(const cbtVector3& rayFrom,
								  const cbtVector3& rayInvDirection,
								  const unsigned int raySign[3],
								  const cbtVector3 bounds[2],
								  cbtScalar& tmin,
								  cbtScalar lambda_min,
								  cbtScalar lambda_max)
{
	cbtScalar tmax, tymin, tymax, tzmin, tzmax;
	tmin = (bounds[raySign[0]].getX() - rayFrom.getX()) * rayInvDirection.getX();
	tmax = (bounds[1 - raySign[0]].getX() - rayFrom.getX()) * rayInvDirection.getX();
	tymin = (bounds[raySign[1]].getY() - rayFrom.getY()) * rayInvDirection.getY();
	tymax = (bounds[1 - raySign[1]].getY() - rayFrom.getY()) * rayInvDirection.getY();

	if ((tmin > tymax) || (tymin > tmax))
		return false;

	if (tymin > tmin)
		tmin = tymin;

	if (tymax < tmax)
		tmax = tymax;

	tzmin = (bounds[raySign[2]].getZ() - rayFrom.getZ()) * rayInvDirection.getZ();
	tzmax = (bounds[1 - raySign[2]].getZ() - rayFrom.getZ()) * rayInvDirection.getZ();

	if ((tmin > tzmax) || (tzmin > tmax))
		return false;
	if (tzmin > tmin)
		tmin = tzmin;
	if (tzmax < tmax)
		tmax = tzmax;
	return ((tmin < lambda_max) && (tmax > lambda_min));
}